

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O1

bool __thiscall
CDBIterator::GetValue<std::pair<uint256,(anonymous_namespace)::DBVal>>
          (CDBIterator *this,pair<uint256,_(anonymous_namespace)::DBVal> *value)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key;
  size_t in_RCX;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  DataStream ssValue;
  DataStream DStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  sp = GetValueImpl(this);
  DataStream::DataStream(&DStack_38,sp);
  key = dbwrapper_private::GetObfuscateKey(this->parent);
  DataStream::Xor(&DStack_38,key);
  DataStream::read(&DStack_38,(int)value,(void *)0x20,in_RCX);
  ActionUnserialize::SerReadWriteMany<DataStream,uint256&,uint256&,FlatFilePos&>
            (&DStack_38,&(value->second).hash,&(value->second).header,&(value->second).pos);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&DStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool GetValue(V& value) {
        try {
            DataStream ssValue{GetValueImpl()};
            ssValue.Xor(dbwrapper_private::GetObfuscateKey(parent));
            ssValue >> value;
        } catch (const std::exception&) {
            return false;
        }
        return true;
    }